

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void rt_pa_set_source_info_and_quit(pa_context *param_1,pa_source_info *i,int eol,void *userdata)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  long lVar4;
  size_t __n;
  char *pcVar5;
  _Alloc_hider __s2;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  undefined8 uVar9;
  rtaudio_pa_format_mapping_t *prVar10;
  RtAudioFormat RVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint *sr;
  uint *__args;
  long lVar15;
  ulong uVar16;
  string name;
  PaDeviceInfo painfo;
  value_type local_f0;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  uint local_a8;
  ushort uStack_a4;
  undefined2 uStack_a2;
  undefined5 uStack_a0;
  bool local_9b;
  pointer local_98;
  iterator iStack_90;
  uint *local_88;
  undefined8 uStack_80;
  ulong local_78;
  value_type local_70;
  
  if (eol != 0) {
    (**(code **)(*userdata + 0x68))(*userdata,0);
    return;
  }
  pcVar8 = (char *)pa_proplist_gets(i->proplist,"device.description");
  std::__cxx11::string::string((string *)&local_f0,pcVar8,(allocator *)local_d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)userdata + 0x58),&local_f0);
  __s2._M_p = local_f0._M_dataplus._M_p;
  lVar4 = **(long **)((long)userdata + 0x78);
  lVar13 = (*(long **)((long)userdata + 0x78))[1] - lVar4;
  if (lVar13 != 0) {
    lVar13 = (lVar13 >> 5) * -0x5555555555555555;
    lVar15 = 0x20;
    lVar14 = 0;
    uVar16 = 0;
    do {
      __n = *(size_t *)(lVar4 + 0x10 + lVar14);
      if (__n == local_f0._M_string_length) {
        if (__n != 0) {
          iVar6 = bcmp(*(void **)(lVar4 + 8 + lVar14),__s2._M_p,__n);
          if (iVar6 != 0) goto LAB_00111d9b;
        }
        lVar4 = **(long **)((long)userdata + 0x70);
        if (uVar16 < (ulong)((*(long **)((long)userdata + 0x70))[1] - lVar4 >> 6)) {
          if (*(long *)(lVar4 + -0x18 + lVar15) == 0) goto LAB_00112025;
          pcVar8 = i->name;
          pcVar5 = *(char **)(lVar4 + 8 + lVar15);
          strlen(pcVar8);
          std::__cxx11::string::_M_replace(lVar4 + lVar15,0,pcVar5,(ulong)pcVar8);
          lVar4 = **(long **)((long)userdata + 0x78);
          uVar12 = ((*(long **)((long)userdata + 0x78))[1] - lVar4 >> 5) * -0x5555555555555555;
          if (uVar16 <= uVar12 && uVar12 - uVar16 != 0) {
            *(uint *)(lVar4 + 0x2c + lVar14) = (uint)(i->sample_spec).channels;
            iVar6 = std::__cxx11::string::compare((char *)((long)userdata + 0x28));
            lVar4 = **(long **)((long)userdata + 0x78);
            uVar12 = ((*(long **)((long)userdata + 0x78))[1] - lVar4 >> 5) * -0x5555555555555555;
            if (uVar16 <= uVar12 && uVar12 - uVar16 != 0) {
              *(bool *)(lVar4 + 0x35 + lVar14) = iVar6 == 0;
              uVar7 = *(uint *)(lVar4 + 0x28 + lVar14);
              uVar3 = *(uint *)(lVar4 + 0x2c + lVar14);
              if (uVar3 < uVar7) {
                uVar7 = uVar3;
              }
              *(uint *)(lVar4 + 0x30 + lVar14) = uVar7;
              goto LAB_00112025;
            }
          }
        }
        uVar9 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        _Unwind_Resume(uVar9);
      }
LAB_00111d9b:
      uVar16 = uVar16 + 1;
      lVar14 = lVar14 + 0x60;
      lVar15 = lVar15 + 0x40;
    } while (lVar13 + (ulong)(lVar13 == 0) != uVar16);
  }
  local_d0._0_4_ = 0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8 = 0;
  uStack_a4 = 0;
  uStack_a2 = 0;
  uStack_a0._0_4_ = 0;
  uStack_a0._4_1_ = false;
  local_9b = false;
  local_98 = (pointer)0x0;
  iStack_90._M_current = (uint *)0x0;
  local_88 = (uint *)0x0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  local_78 = 0;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_assign((string *)&local_c8);
  uStack_a4 = (ushort)(i->sample_spec).channels;
  uStack_a2 = 0;
  uStack_80._4_4_ = (i->sample_spec).rate;
  iVar6 = std::__cxx11::string::compare((char *)((long)userdata + 0x28));
  local_9b = iVar6 == 0;
  __args = SUPPORTED_SAMPLERATES;
  uVar7 = 8000;
  do {
    if (iStack_90._M_current == local_88) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,iStack_90,__args);
    }
    else {
      *iStack_90._M_current = uVar7;
      iStack_90._M_current = iStack_90._M_current + 1;
    }
    uVar7 = __args[1];
    __args = __args + 1;
  } while (uVar7 != 0);
  RVar11 = 2;
  prVar10 = supported_sampleformats;
  do {
    prVar10 = prVar10 + 1;
    local_78 = local_78 | RVar11;
    RVar11 = prVar10->rtaudio_format;
  } while (RVar11 != 0);
  local_d0._0_4_ = **(uint **)((long)userdata + 0x50);
  **(uint **)((long)userdata + 0x50) = local_d0._0_4_ + 1;
  std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
            (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
              ((long)userdata + 0x78),(value_type *)local_d0);
  paVar1 = &local_70.sinkName.field_2;
  local_70.sinkName._M_string_length = 0;
  local_70.sinkName.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_70.sourceName.field_2;
  local_70.sourceName._M_string_length = 0;
  local_70.sourceName.field_2._M_local_buf[0] = '\0';
  pcVar8 = i->name;
  local_70.sinkName._M_dataplus._M_p = (pointer)paVar1;
  local_70.sourceName._M_dataplus._M_p = (pointer)paVar2;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)&local_70.sourceName,0,(char *)0x0,(ulong)pcVar8);
  std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::push_back
            (*(vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_> **)
              ((long)userdata + 0x70),&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.sourceName._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.sourceName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.sinkName._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.sinkName._M_dataplus._M_p);
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p);
  }
LAB_00112025:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void rt_pa_set_source_info_and_quit( pa_context * /*c*/, const pa_source_info *i,
                                            int eol, void *userdata )
{
  PaDeviceProbeInfo *paProbeInfo = static_cast<PaDeviceProbeInfo *>( userdata );
  if ( eol ) {
    paProbeInfo->paMainLoopApi->quit( paProbeInfo->paMainLoopApi, 0 );
    return;
  }

  std::string name = pa_proplist_gets( i->proplist, "device.description" );
  paProbeInfo->deviceNames.push_back( name );
  for ( size_t n=0; n<paProbeInfo->rtDeviceList->size(); n++ ) {
    if ( paProbeInfo->rtDeviceList->at(n).name == name ) {
      // Check if we've already probed this as an output.
      if ( !paProbeInfo->paDeviceList->at(n).sinkName.empty() ) {
        // This must be a duplex device. Update the device info.
        paProbeInfo->paDeviceList->at(n).sourceName = i->name;
        paProbeInfo->rtDeviceList->at(n).inputChannels = i->sample_spec.channels;
        paProbeInfo->rtDeviceList->at(n).isDefaultInput = ( paProbeInfo->defaultSourceName == i->name );
        paProbeInfo->rtDeviceList->at(n).duplexChannels = 
          (paProbeInfo->rtDeviceList->at(n).inputChannels < paProbeInfo->rtDeviceList->at(n).outputChannels)
          ? paProbeInfo->rtDeviceList->at(n).inputChannels : paProbeInfo->rtDeviceList->at(n).outputChannels;
      }
      return; // we already have this
    }
  }

  RtAudio::DeviceInfo info;
  info.name = name;
  info.inputChannels = i->sample_spec.channels;
  info.preferredSampleRate = i->sample_spec.rate;
  info.isDefaultInput = ( paProbeInfo->defaultSourceName == i->name );
  for ( const unsigned int *sr = SUPPORTED_SAMPLERATES; *sr; ++sr )
    info.sampleRates.push_back( *sr );
  for ( const rtaudio_pa_format_mapping_t *fm = supported_sampleformats; fm->rtaudio_format; ++fm )
    info.nativeFormats |= fm->rtaudio_format;
  info.ID = *(paProbeInfo->currentDeviceId);
  *(paProbeInfo->currentDeviceId) = info.ID + 1;
  paProbeInfo->rtDeviceList->push_back( info );

  RtApiPulse::PaDeviceInfo painfo;
  painfo.sourceName = i->name;
  paProbeInfo->paDeviceList->push_back( painfo );
}